

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void synthesisU16(OpenJTalk *oj,char16_t *txt)

{
  char *txt_00;
  
  txt_00 = convert_charset((char *)txt,CS_UTF_16LE,CS_UTF_8);
  synthesis(oj,txt_00);
  free(txt_00);
  return;
}

Assistant:

void synthesisU16(OpenJTalk *oj, const char16_t *txt)
{
#if defined(_WIN32)
	if (g_verbose)
	{
		console_message("charset: UTF-16\n");
	}
#endif
	char *txt_utf8 = u16tou8((char16_t *)txt);
	synthesis(oj, txt_utf8);
	free(txt_utf8);
}